

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

deque<Diff,_std::allocator<Diff>_> * __thiscall
diff_match_patch_test::diffList
          (deque<Diff,_std::allocator<Diff>_> *__return_storage_ptr__,diff_match_patch_test *this,
          Diff *d1,Diff *d2,Diff *d3,Diff *d4,Diff *d5,Diff *d6,Diff *d7,Diff *d8,Diff *d9,Diff *d10
          )

{
  std::_Deque_base<Diff,_std::allocator<Diff>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<Diff,_std::allocator<Diff>_>);
  if ((d1->operation != Insert) || ((d1->text)._M_string_length != 0)) {
    std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d1);
    if ((d2->operation != Insert) || ((d2->text)._M_string_length != 0)) {
      std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d2);
      if ((d3->operation != Insert) || ((d3->text)._M_string_length != 0)) {
        std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d3);
        if ((d4->operation != Insert) || ((d4->text)._M_string_length != 0)) {
          std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d4);
          if ((d5->operation != Insert) || ((d5->text)._M_string_length != 0)) {
            std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d5);
            if ((d6->operation != Insert) || ((d6->text)._M_string_length != 0)) {
              std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d6);
              if ((d7->operation != Insert) || ((d7->text)._M_string_length != 0)) {
                std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d7);
                if ((d8->operation != Insert) || ((d8->text)._M_string_length != 0)) {
                  std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d8);
                  if ((d9->operation != Insert) || ((d9->text)._M_string_length != 0)) {
                    std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d9);
                    if ((d10->operation != Insert) || ((d10->text)._M_string_length != 0)) {
                      std::deque<Diff,_std::allocator<Diff>_>::push_back(__return_storage_ptr__,d10)
                      ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<Diff> diff_match_patch_test::diffList(Diff d1, Diff d2, Diff d3, Diff d4, Diff d5,
  Diff d6, Diff d7, Diff d8, Diff d9, Diff d10) {
  // Diff(Diff::Operation::Insert, NULL) is invalid and thus is used as the default argument.
  std::deque<Diff> listRet;
  if (d1.operation == Diff::Operation::Insert && d1.text.empty()) {
    return listRet;
  }
  listRet.push_back(d1);

  if (d2.operation == Diff::Operation::Insert && d2.text.empty()) {
    return listRet;
  }
  listRet.push_back(d2);

  if (d3.operation == Diff::Operation::Insert && d3.text.empty()) {
    return listRet;
  }
  listRet.push_back(d3);

  if (d4.operation == Diff::Operation::Insert && d4.text.empty()) {
    return listRet;
  }
  listRet.push_back(d4);

  if (d5.operation == Diff::Operation::Insert && d5.text.empty()) {
    return listRet;
  }
  listRet.push_back(d5);

  if (d6.operation == Diff::Operation::Insert && d6.text.empty()) {
    return listRet;
  }
  listRet.push_back(d6);

  if (d7.operation == Diff::Operation::Insert && d7.text.empty()) {
    return listRet;
  }
  listRet.push_back(d7);

  if (d8.operation == Diff::Operation::Insert && d8.text.empty()) {
    return listRet;
  }
  listRet.push_back(d8);

  if (d9.operation == Diff::Operation::Insert && d9.text.empty()) {
    return listRet;
  }
  listRet.push_back(d9);

  if (d10.operation == Diff::Operation::Insert && d10.text.empty()) {
    return listRet;
  }
  listRet.push_back(d10);

  return listRet;
}